

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

int __thiscall
SslUdpSocketImpl::DatenEncode(SslUdpSocketImpl *this,uint8_t *buf,size_t nAnzahl,string *strAddress)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  long *szBuffer;
  SSL *pSVar4;
  wstring *pwVar5;
  int iErrorHint;
  unique_lock<std::mutex> lock;
  __array temp;
  size_t len;
  uint local_b4;
  size_t local_b0;
  unique_lock<std::mutex> local_a8;
  undefined1 local_98 [16];
  _Head_base<0UL,_unsigned_char_*,_false> local_88 [2];
  long local_78 [2];
  size_t local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  mutex *local_40;
  uint8_t *local_38;
  
  iVar3 = -1;
  if (((this->m_bCloseReq == false) &&
      (iVar2 = OpenSSLWrapper::SslConnection::SSLGetShutdown
                         ((this->m_pSslCon)._M_t.
                          super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                          .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                          _M_head_impl), iVar2 < 1)) &&
     (iVar3 = 0, nAnzahl != 0 && buf != (uint8_t *)0x0)) {
    iVar3 = OpenSSLWrapper::SslConnection::SslInitFinished
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    if (iVar3 == 1) {
      local_b4 = 0;
      local_38 = buf;
      local_b0 = OpenSSLWrapper::SslConnection::SslWrite
                           ((this->m_pSslCon)._M_t.
                            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                            _M_head_impl,buf,nAnzahl,(int *)&local_b4);
      if (((local_b0 < nAnzahl) &&
          (local_40 = &this->m_mxEnDecode, local_68 = nAnzahl, local_b4 < 4)) && (local_b4 != 1)) {
        OpenSSLWrapper::SslConnection::GetShutDownFlag
                  ((this->m_pSslCon)._M_t.
                   super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
      }
      local_a8._M_device = &this->m_mxEnDecode;
      local_a8._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_a8);
      local_a8._M_owns = true;
      __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
      if (__n != 0) {
        __mutex = &(this->super_UdpSocketImpl).m_mxOutDeque;
        do {
          szBuffer = (long *)operator_new__(__n);
          memset(szBuffer,0,__n);
          local_88[0]._M_head_impl = (uchar *)szBuffer;
          local_60._M_dataplus._M_p =
               (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                                  ((this->m_pSslCon)._M_t.
                                   super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                   .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                   _M_head_impl,(uint8_t *)szBuffer,__n);
          if (local_60._M_dataplus._M_p != (pointer)0x0) {
            iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
            if (iVar3 != 0) {
              std::__throw_system_error(iVar3);
            }
            LOCK();
            paVar1 = &(this->super_UdpSocketImpl).m_atOutBytes;
            (paVar1->super___atomic_base<unsigned_long>)._M_i =
                 (__int_type)
                 ((paVar1->super___atomic_base<unsigned_long>)._M_i +
                 (long)local_60._M_dataplus._M_p);
            UNLOCK();
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                        *)&(this->super_UdpSocketImpl).m_quOutData,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       local_88,(unsigned_long *)&local_60,strAddress);
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
          __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
          if ((long *)local_88[0]._M_head_impl != (long *)0x0) {
            operator_delete__(local_88[0]._M_head_impl);
          }
        } while (__n != 0);
      }
      std::unique_lock<std::mutex>::unlock(&local_a8);
      std::unique_lock<std::mutex>::~unique_lock(&local_a8);
      iVar3 = 1;
    }
    else {
      pSVar4 = OpenSSLWrapper::SslConnection::operator()
                         ((this->m_pSslCon)._M_t.
                          super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                          .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                          _M_head_impl);
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_60,vswprintf,0x20,L"%lu",pSVar4)
      ;
      pwVar5 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_60,0,(wchar_t *)0x0,0x13447c)
      ;
      std::__cxx11::wstring::wstring((wstring *)local_88,pwVar5);
      pwVar5 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_88);
      std::__cxx11::wstring::wstring((wstring *)&local_a8,pwVar5);
      OutputDebugString((wchar_t *)local_a8._M_device);
      if (local_a8._M_device != (mutex_type *)local_98) {
        operator_delete(local_a8._M_device,local_98._0_8_ * 4 + 4);
      }
      if ((long *)local_88[0]._M_head_impl != local_78) {
        operator_delete(local_88[0]._M_head_impl,local_78[0] * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 4 + 4);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int SslUdpSocketImpl::DatenEncode(const uint8_t* buf, size_t nAnzahl, const string& strAddress)
{
    if (m_bCloseReq == true)
        return -1;
    if (m_pSslCon->SSLGetShutdown() >= SSL_SENT_SHUTDOWN)
        return -1;

    if (buf == nullptr || nAnzahl == 0)
        return 0;

    const int iSslInit = m_pSslCon->SslInitFinished();
    if (iSslInit == 1)
    {
        int iErrorHint = 0;
        size_t nWritten = m_pSslCon->SslWrite(buf, nAnzahl, &iErrorHint);
        while (nWritten < nAnzahl && (iErrorHint == 0 || iErrorHint == SSL_ERROR_WANT_READ || iErrorHint == SSL_ERROR_WANT_WRITE) && m_pSslCon->GetShutDownFlag() == INT32_MIN)
        {
            unique_lock<mutex> lock(m_mxEnDecode);
            // Get the out Que of the openssl bio, the buffer is already encrypted
            size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len, strAddress);
                    m_mxOutDeque.unlock();
                }

                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }
            lock.unlock();
            nWritten += m_pSslCon->SslWrite(&buf[nWritten], nAnzahl - nWritten, &iErrorHint);
        }

        unique_lock<mutex> lock(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, strAddress);
                m_mxOutDeque.unlock();
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock.unlock();
        return 1;
    }
    else
    {
        OutputDebugString(wstring(L"SSL not initialized: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
    }

    return 0;
}